

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeTarget(Parse *pParse,Expr *pExpr,int target)

{
  u8 uVar1;
  Vdbe *pVVar2;
  AggInfo *pAVar3;
  Table *pTVar4;
  ExprList *pEVar5;
  Expr *pEVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  u32 addr_00;
  int iVar10;
  int iVar11;
  sqlite3 *psVar12;
  char *pcVar13;
  char *pP4;
  bool bVar14;
  int local_1fc;
  Expr *local_1d8;
  Expr *pTest;
  Expr *pX;
  Expr opCompare;
  ExprList_item *aListelem;
  ExprList *pEList;
  int i_1;
  int nExpr;
  int nextCase;
  int endLabel;
  int addrINR;
  int p1;
  Table *pTab;
  int destIfNull;
  int destIfFalse;
  int n_1;
  int nCol;
  u8 exprOp;
  CollSeq *pCStack_138;
  int endCoalesce;
  CollSeq *pColl;
  u8 enc;
  sqlite3 *db;
  int i;
  u32 constMask;
  char *zId;
  FuncDef *pDef;
  ExprList *pEStack_100;
  int nFarg;
  ExprList *pFarg;
  AggInfo *pInfo;
  int addr;
  int bNormal;
  int isTrue;
  Expr *pLeft_1;
  Expr *pLeft;
  char *z_1;
  char *zBlob;
  char *z;
  int n;
  int aff;
  int iReg;
  int iTab;
  AggInfo_col *pCol;
  AggInfo *pAggInfo;
  undefined1 local_90 [4];
  int p5;
  Expr tempX;
  int r2;
  int r1;
  int regFree2;
  int regFree1;
  int inReg;
  int op;
  Vdbe *v;
  Expr *pEStack_20;
  int target_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  pVVar2 = pParse->pVdbe;
  r1 = 0;
  r2 = 0;
  pAggInfo._4_4_ = 0;
  pEStack_20 = pExpr;
  if (pVVar2 == (Vdbe *)0x0) {
    pParse_local._4_4_ = 0;
  }
  else {
LAB_0022be75:
    if (pEStack_20 == (Expr *)0x0) {
      regFree1 = 0x72;
    }
    else {
      regFree1 = (int)pEStack_20->op;
    }
    regFree2 = target;
    _inReg = pVVar2;
    v._4_4_ = target;
    pExpr_local = (Expr *)pParse;
    switch(regFree1) {
    case 0x13:
    case 0x6b:
      tempX.y.sub.regReturn = sqlite3ExprCodeTemp(pParse,pEStack_20->pLeft,&r1);
      sqlite3VdbeAddOp2(_inReg,regFree1,tempX.y.sub.regReturn,regFree2);
      break;
    case 0x14:
    case 0x83:
      if ((regFree1 != 0x83) || (iVar10 = ((pEStack_20->x).pSelect)->pEList->nExpr, iVar10 == 1)) {
        iVar10 = sqlite3CodeSubselect(pParse,pEStack_20);
        return iVar10;
      }
      sqlite3SubselectError(pParse,iVar10,1);
      break;
    default:
      local_1d8 = (Expr *)0x0;
      pEVar5 = (pEStack_20->x).pList;
      opCompare.y.pTab = (Table *)pEVar5->a;
      uVar8 = pEVar5->nExpr;
      iVar10 = sqlite3VdbeMakeLabel(pParse);
      pEVar6 = pEStack_20->pLeft;
      if (pEVar6 != (Expr *)0x0) {
        exprNodeCopy((Expr *)local_90,pEVar6);
        iVar11 = exprCodeVector((Parse *)pExpr_local,(Expr *)local_90,&r1);
        exprToRegister((Expr *)local_90,iVar11);
        memset(&pX,0,0x48);
        pX._0_1_ = 0x35;
        opCompare.u.zToken = local_90;
        local_1d8 = (Expr *)&pX;
        r1 = 0;
      }
      for (pEList._0_4_ = 0; (int)pEList < (int)(uVar8 - 1); pEList._0_4_ = (int)pEList + 2) {
        if (pEVar6 == (Expr *)0x0) {
          local_1d8 = (Expr *)(&(opCompare.y.pTab)->zName)[(long)(int)pEList * 4];
        }
        else {
          opCompare.pLeft = (Expr *)(&(opCompare.y.pTab)->zName)[(long)(int)pEList * 4];
        }
        iVar11 = sqlite3VdbeMakeLabel((Parse *)pExpr_local);
        sqlite3ExprIfFalse((Parse *)pExpr_local,local_1d8,iVar11,0x10);
        sqlite3ExprCode((Parse *)pExpr_local,
                        (Expr *)(&(opCompare.y.pTab)->zName)[(long)((int)pEList + 1) * 4],v._4_4_);
        sqlite3VdbeGoto(_inReg,iVar10);
        sqlite3VdbeResolveLabel(_inReg,iVar11);
      }
      if ((uVar8 & 1) == 0) {
        sqlite3VdbeAddOp2(_inReg,0x49,0,v._4_4_);
      }
      else {
        sqlite3ExprCode((Parse *)pExpr_local,pEVar5->a[(int)(uVar8 - 1)].pExpr,v._4_4_);
      }
      sqlite3VdbeResolveLabel(_inReg,iVar10);
      break;
    case 0x24:
      regFree2 = sqlite3ExprCodeTarget(pParse,pEStack_20->pLeft,target);
      if (regFree2 != v._4_4_) {
        sqlite3VdbeAddOp2(_inReg,0x4f,regFree2,v._4_4_);
        regFree2 = v._4_4_;
      }
      iVar10 = v._4_4_;
      pVVar2 = _inReg;
      cVar7 = sqlite3AffinityType((pEStack_20->u).zToken,(Column *)0x0);
      sqlite3VdbeAddOp2(pVVar2,0x55,iVar10,(int)cVar7);
      return regFree2;
    case 0x2b:
    case 0x2c:
    case 0x60:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
      tempX.y.sub.regReturn = sqlite3ExprCodeTemp(pParse,pEStack_20->pLeft,&r1);
      tempX.y.sub.iAddr = sqlite3ExprCodeTemp((Parse *)pExpr_local,pEStack_20->pRight,&r2);
      sqlite3VdbeAddOp3(_inReg,regFree1,tempX.y.sub.iAddr,tempX.y.sub.regReturn,v._4_4_);
      break;
    case 0x2d:
    case 0xa0:
      bVar14 = regFree1 == 0x2d;
      regFree1 = 0x34;
      if (bVar14) {
        regFree1 = 0x35;
      }
      pAggInfo._4_4_ = 0x80;
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      pEVar6 = pEStack_20->pLeft;
      iVar10 = sqlite3ExprIsVector(pEVar6);
      if (iVar10 == 0) {
        tempX.y.sub.regReturn = sqlite3ExprCodeTemp((Parse *)pExpr_local,pEVar6,&r1);
        tempX.y.sub.iAddr = sqlite3ExprCodeTemp((Parse *)pExpr_local,pEStack_20->pRight,&r2);
        codeCompare((Parse *)pExpr_local,pEVar6,pEStack_20->pRight,regFree1,tempX.y.sub.regReturn,
                    tempX.y.sub.iAddr,regFree2,pAggInfo._4_4_ | 0x20);
      }
      else {
        codeVectorCompare((Parse *)pExpr_local,pEStack_20,v._4_4_,(u8)regFree1,(u8)pAggInfo._4_4_);
      }
      break;
    case 0x30:
      exprCodeBetween(pParse,pEStack_20,target,(_func_void_Parse_ptr_Expr_ptr_int_int *)0x0,0);
      return v._4_4_;
    case 0x31:
      iVar10 = sqlite3VdbeMakeLabel(pParse);
      iVar11 = sqlite3VdbeMakeLabel((Parse *)pExpr_local);
      sqlite3VdbeAddOp2(_inReg,0x49,0,v._4_4_);
      sqlite3ExprCodeIN((Parse *)pExpr_local,pEStack_20,iVar10,iVar11);
      sqlite3VdbeAddOp2(_inReg,0x46,1,v._4_4_);
      sqlite3VdbeResolveLabel(_inReg,iVar10);
      sqlite3VdbeAddOp2(_inReg,0x53,v._4_4_,0);
      sqlite3VdbeResolveLabel(_inReg,iVar11);
      return v._4_4_;
    case 0x32:
    case 0x33:
      sqlite3VdbeAddOp2(pVVar2,0x46,1,target);
      tempX.y.sub.regReturn = sqlite3ExprCodeTemp((Parse *)pExpr_local,pEStack_20->pLeft,&r1);
      iVar10 = sqlite3VdbeAddOp1(_inReg,regFree1,tempX.y.sub.regReturn);
      sqlite3VdbeAddOp2(_inReg,0x46,0,v._4_4_);
      sqlite3VdbeJumpHere(_inReg,iVar10);
      break;
    case 0x47:
      if (pParse->pTriggerTab == (Table *)0x0) {
        sqlite3ErrorMsg(pParse,"RAISE() may only be used within a trigger-program");
        return 0;
      }
      if (pEStack_20->affinity == '\x02') {
        sqlite3MayAbort(pParse);
      }
      if (pEStack_20->affinity == '\x04') {
        sqlite3VdbeAddOp4(_inReg,0x45,0,4,0,(pEStack_20->u).zToken,0);
      }
      else {
        sqlite3HaltConstraint
                  ((Parse *)pExpr_local,0x713,(int)pEStack_20->affinity,(pEStack_20->u).zToken,'\0',
                   '\0');
      }
      break;
    case 0x4d:
      pTVar4 = (pEStack_20->y).pTab;
      sqlite3VdbeAddOp2(pVVar2,0x95,
                        pEStack_20->iTable * (pTVar4->nCol + 1) + 1 + (int)pEStack_20->iColumn,
                        target);
      if ((-1 < pEStack_20->iColumn) && (pTVar4->aCol[pEStack_20->iColumn].affinity == 'E')) {
        sqlite3VdbeAddOp1(_inReg,0x54,v._4_4_);
      }
      break;
    case 0x6a:
    case 0xa6:
    case 0xad:
      goto switchD_0022bebe_caseD_6a;
    case 0x6e:
      sqlite3VdbeLoadString(pVVar2,target,(pEStack_20->u).zToken);
      return v._4_4_;
    case 0x72:
      sqlite3VdbeAddOp2(pVVar2,0x49,0,target);
      return v._4_4_;
    case 0x91:
      codeReal(pVVar2,(pEStack_20->u).zToken,0,target);
      return v._4_4_;
    case 0x92:
      pcVar13 = (pEStack_20->u).zToken;
      iVar10 = sqlite3Strlen30(pcVar13 + 2);
      psVar12 = sqlite3VdbeDb(_inReg);
      pcVar13 = (char *)sqlite3HexToBlob(psVar12,pcVar13 + 2,iVar10 + -1);
      sqlite3VdbeAddOp4(_inReg,0x4b,(iVar10 + -1) / 2,v._4_4_,0,pcVar13,-7);
      return v._4_4_;
    case 0x93:
      codeInteger(pParse,pEStack_20,0,target);
      return v._4_4_;
    case 0x94:
      sqlite3VdbeAddOp2(pVVar2,0x4c,(int)pEStack_20->iColumn,target);
      if ((pEStack_20->u).zToken[1] != '\0') {
        pP4 = sqlite3VListNumToName((VList *)pExpr_local[4].u.zToken,(int)pEStack_20->iColumn);
        pcVar13 = pExpr_local[4].u.zToken;
        pcVar13[0] = '\0';
        pcVar13[1] = '\0';
        pcVar13[2] = '\0';
        pcVar13[3] = '\0';
        sqlite3VdbeAppendP4(_inReg,pP4,-1);
      }
      return v._4_4_;
    case 0x9f:
      iVar10 = sqlite3ExprTruthValue(pEStack_20);
      sqlite3VdbeAddOp2(pVVar2,0x46,iVar10,v._4_4_);
      return v._4_4_;
    case 0xa1:
      db._4_4_ = 0;
      psVar12 = pParse->db;
      uVar1 = psVar12->enc;
      pCStack_138 = (CollSeq *)0x0;
      if ((pEStack_20->flags & 0x1000000) != 0) {
        return ((pEStack_20->y).pWin)->regResult;
      }
      if ((pParse->okConstFactor != '\0') &&
         (iVar10 = sqlite3ExprIsConstantNotJoin(pEStack_20), iVar10 != 0)) {
        iVar10 = sqlite3ExprCodeAtInit((Parse *)pExpr_local,pEStack_20,-1);
        return iVar10;
      }
      if ((pEStack_20->flags & 0x4000) == 0) {
        pEStack_100 = (pEStack_20->x).pList;
      }
      else {
        pEStack_100 = (ExprList *)0x0;
      }
      if (pEStack_100 == (ExprList *)0x0) {
        local_1fc = 0;
      }
      else {
        local_1fc = pEStack_100->nExpr;
      }
      pcVar13 = (pEStack_20->u).zToken;
      zId = &sqlite3FindFunction(psVar12,pcVar13,local_1fc,uVar1,'\0')->nArg;
      if (((FuncDef *)zId == (FuncDef *)0x0) ||
         (((FuncDef *)zId)->xFinalize != (_func_void_sqlite3_context_ptr *)0x0)) {
        sqlite3ErrorMsg((Parse *)pExpr_local,"unknown function: %s()",pcVar13);
      }
      else {
        if ((((FuncDef *)zId)->funcFlags & 0x200) == 0) {
          if ((((FuncDef *)zId)->funcFlags & 0x400) != 0) {
            iVar10 = sqlite3ExprCodeTarget((Parse *)pExpr_local,pEStack_100->a[0].pExpr,v._4_4_);
            return iVar10;
          }
          for (db._0_4_ = 0; (int)db < local_1fc; db._0_4_ = (int)db + 1) {
            if (((int)db < 0x20) &&
               (iVar10 = sqlite3ExprIsConstant(pEStack_100->a[(int)db].pExpr), iVar10 != 0)) {
              db._4_4_ = 1 << ((byte)(int)db & 0x1f) | db._4_4_;
            }
            if (((((FuncDef *)zId)->funcFlags & 0x20) != 0) && (pCStack_138 == (CollSeq *)0x0)) {
              pCStack_138 = sqlite3ExprCollSeq((Parse *)pExpr_local,pEStack_100->a[(int)db].pExpr);
            }
          }
          if (pEStack_100 == (ExprList *)0x0) {
            tempX.y.sub.regReturn = 0;
          }
          else {
            if (db._4_4_ == 0) {
              tempX.y.sub.regReturn = sqlite3GetTempRange((Parse *)pExpr_local,local_1fc);
            }
            else {
              tempX.y.sub.regReturn = *(int *)&pExpr_local->pAggInfo + 1;
              *(int *)&pExpr_local->pAggInfo = local_1fc + *(int *)&pExpr_local->pAggInfo;
            }
            if (((((FuncDef *)zId)->funcFlags & 0xc0) != 0) &&
               ((uVar1 = (pEStack_100->a[0].pExpr)->op, uVar1 == 0xa2 || (uVar1 == 0xa4)))) {
              (pEStack_100->a[0].pExpr)->op2 = (byte)((FuncDef *)zId)->funcFlags & 0xc0;
            }
            sqlite3ExprCodeExprList((Parse *)pExpr_local,pEStack_100,tempX.y.sub.regReturn,0,'\x03')
            ;
          }
          if ((local_1fc < 2) || ((pEStack_20->flags & 0x80) == 0)) {
            if (0 < local_1fc) {
              zId = &sqlite3VtabOverloadFunction
                               (psVar12,(FuncDef *)zId,local_1fc,pEStack_100->a[0].pExpr)->nArg;
            }
          }
          else {
            zId = &sqlite3VtabOverloadFunction
                             (psVar12,(FuncDef *)zId,local_1fc,*(Expr **)(pEStack_100 + 1))->nArg;
          }
          if ((*(uint *)(zId + 4) & 0x20) != 0) {
            if (pCStack_138 == (CollSeq *)0x0) {
              pCStack_138 = psVar12->pDfltColl;
            }
            sqlite3VdbeAddOp4(_inReg,0x52,0,0,0,(char *)pCStack_138,-2);
          }
          iVar10 = 0x3f;
          if ((pExpr_local->y).sub.iAddr != 0) {
            iVar10 = 0x3e;
          }
          sqlite3VdbeAddOp4(_inReg,iVar10,db._4_4_,tempX.y.sub.regReturn,v._4_4_,zId,-8);
          sqlite3VdbeChangeP5(_inReg,(ushort)local_1fc & 0xff);
          if ((local_1fc != 0) && (db._4_4_ == 0)) {
            sqlite3ReleaseTempRange((Parse *)pExpr_local,tempX.y.sub.regReturn,local_1fc);
          }
          return v._4_4_;
        }
        iVar10 = sqlite3VdbeMakeLabel((Parse *)pExpr_local);
        sqlite3ExprCode((Parse *)pExpr_local,pEStack_100->a[0].pExpr,v._4_4_);
        for (db._0_4_ = 1; (int)db < local_1fc; db._0_4_ = (int)db + 1) {
          sqlite3VdbeAddOp2(_inReg,0x33,v._4_4_,iVar10);
          sqlite3ExprCode((Parse *)pExpr_local,pEStack_100->a[(int)db].pExpr,v._4_4_);
        }
        sqlite3VdbeResolveLabel(_inReg,iVar10);
      }
      break;
    case 0xa3:
      if (pEStack_20->pAggInfo != (AggInfo *)0x0) {
        return pEStack_20->pAggInfo->aFunc[pEStack_20->iAgg].iMem;
      }
      sqlite3ErrorMsg(pParse,"misuse of aggregate: %s()",(pEStack_20->u).zToken);
      break;
    case 0xa4:
      pAVar3 = pEStack_20->pAggInfo;
      if (pAVar3->directMode == '\0') {
        return pAVar3->aCol[pEStack_20->iAgg].iMem;
      }
      if (pAVar3->useSortingIdx != '\0') {
        sqlite3VdbeAddOp3(pVVar2,0x5a,pAVar3->sortingIdxPTab,
                          pAVar3->aCol[pEStack_20->iAgg].iSorterColumn,target);
        return v._4_4_;
      }
    case 0xa2:
      aff = pEStack_20->iTable;
      if ((pEStack_20->flags & 8) != 0) {
        n = sqlite3ExprCodeTarget(pParse,pEStack_20->pLeft,target);
        cVar7 = sqlite3TableColumnAffinity((pEStack_20->y).pTab,(int)pEStack_20->iColumn);
        if (cVar7 != 0x41) {
          if (n != v._4_4_) {
            sqlite3VdbeAddOp2(_inReg,0x4f,n,v._4_4_);
            n = v._4_4_;
          }
          sqlite3VdbeAddOp4(_inReg,0x5b,n,1,0,"B" + (cVar7 + -0x42) * 2,-1);
        }
        return n;
      }
      if (aff < 0) {
        if (pParse->iSelfTab < 0) {
          return (int)pEStack_20->iColumn - pParse->iSelfTab;
        }
        aff = pParse->iSelfTab + -1;
      }
      iVar10 = sqlite3ExprCodeGetColumn
                         (pParse,(pEStack_20->y).pTab,(int)pEStack_20->iColumn,aff,target,
                          pEStack_20->op2);
      return iVar10;
    case 0xa5:
      pEVar6 = pEStack_20->pLeft;
      if (pEVar6->op == 0x93) {
        codeInteger(pParse,pEVar6,1,target);
        return v._4_4_;
      }
      if (pEVar6->op == 0x91) {
        codeReal(pVVar2,(pEVar6->u).zToken,1,target);
        return v._4_4_;
      }
      local_90[0] = 0x93;
      p5 = 0x4400;
      tempX.op = '\0';
      tempX.affinity = '\0';
      tempX._2_2_ = 0;
      tempX.y.sub.regReturn = sqlite3ExprCodeTemp(pParse,(Expr *)local_90,&r1);
      tempX.y.sub.iAddr = sqlite3ExprCodeTemp((Parse *)pExpr_local,pEStack_20->pLeft,&r2);
      sqlite3VdbeAddOp3(_inReg,0x65,tempX.y.sub.iAddr,tempX.y.sub.regReturn,v._4_4_);
      break;
    case 0xa7:
      tempX.y.sub.regReturn = sqlite3ExprCodeTemp(pParse,pEStack_20->pLeft,&r1);
      uVar8 = sqlite3ExprTruthValue(pEStack_20->pRight);
      sqlite3VdbeAddOp4Int
                (_inReg,0x58,tempX.y.sub.regReturn,regFree2,(uint)((uVar8 != 0 ^ 0xffU) & 1),
                 uVar8 ^ pEStack_20->op2 == '-');
      break;
    case 0xa8:
      return pEStack_20->iTable;
    case 0xa9:
      sqlite3ErrorMsg(pParse,"row value misused");
      break;
    case 0xaa:
      if (pEStack_20->pLeft->iTable == 0) {
        iVar10 = sqlite3CodeSubselect(pParse,pEStack_20->pLeft);
        pEStack_20->pLeft->iTable = iVar10;
      }
      if ((pEStack_20->iTable != 0) &&
         (uVar8 = pEStack_20->iTable, uVar9 = sqlite3ExprVectorSize(pEStack_20->pLeft),
         uVar8 != uVar9)) {
        sqlite3ErrorMsg((Parse *)pExpr_local,"%d columns assigned %d values",
                        (ulong)(uint)pEStack_20->iTable,(ulong)uVar9);
      }
      return pEStack_20->pLeft->iTable + (int)pEStack_20->iColumn;
    case 0xab:
      addr_00 = sqlite3VdbeAddOp1(pVVar2,0x15,pEStack_20->iTable);
      regFree2 = sqlite3ExprCodeTarget((Parse *)pExpr_local,pEStack_20->pLeft,v._4_4_);
      sqlite3VdbeJumpHere(_inReg,addr_00);
      sqlite3VdbeChangeP3(_inReg,addr_00,regFree2);
    }
    sqlite3ReleaseTempReg((Parse *)pExpr_local,r1);
    sqlite3ReleaseTempReg((Parse *)pExpr_local,r2);
    pParse_local._4_4_ = regFree2;
  }
  return pParse_local._4_4_;
switchD_0022bebe_caseD_6a:
  pEStack_20 = pEStack_20->pLeft;
  goto LAB_0022be75;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTarget(Parse *pParse, Expr *pExpr, int target){
  Vdbe *v = pParse->pVdbe;  /* The VM under construction */
  int op;                   /* The opcode being coded */
  int inReg = target;       /* Results stored in register inReg */
  int regFree1 = 0;         /* If non-zero free this temporary register */
  int regFree2 = 0;         /* If non-zero free this temporary register */
  int r1, r2;               /* Various register numbers */
  Expr tempX;               /* Temporary expression node */
  int p5 = 0;

  assert( target>0 && target<=pParse->nMem );
  if( v==0 ){
    assert( pParse->db->mallocFailed );
    return 0;
  }

expr_code_doover:
  if( pExpr==0 ){
    op = TK_NULL;
  }else{
    op = pExpr->op;
  }
  switch( op ){
    case TK_AGG_COLUMN: {
      AggInfo *pAggInfo = pExpr->pAggInfo;
      struct AggInfo_col *pCol = &pAggInfo->aCol[pExpr->iAgg];
      if( !pAggInfo->directMode ){
        assert( pCol->iMem>0 );
        return pCol->iMem;
      }else if( pAggInfo->useSortingIdx ){
        sqlite3VdbeAddOp3(v, OP_Column, pAggInfo->sortingIdxPTab,
                              pCol->iSorterColumn, target);
        return target;
      }
      /* Otherwise, fall thru into the TK_COLUMN case */
    }
    case TK_COLUMN: {
      int iTab = pExpr->iTable;
      if( ExprHasProperty(pExpr, EP_FixedCol) ){
        /* This COLUMN expression is really a constant due to WHERE clause
        ** constraints, and that constant is coded by the pExpr->pLeft
        ** expresssion.  However, make sure the constant has the correct
        ** datatype by applying the Affinity of the table column to the
        ** constant.
        */
        int iReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft,target);
        int aff = sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
        if( aff!=SQLITE_AFF_BLOB ){
          static const char zAff[] = "B\000C\000D\000E";
          assert( SQLITE_AFF_BLOB=='A' );
          assert( SQLITE_AFF_TEXT=='B' );
          if( iReg!=target ){
            sqlite3VdbeAddOp2(v, OP_SCopy, iReg, target);
            iReg = target;
          }
          sqlite3VdbeAddOp4(v, OP_Affinity, iReg, 1, 0,
                            &zAff[(aff-'B')*2], P4_STATIC);
        }
        return iReg;
      }
      if( iTab<0 ){
        if( pParse->iSelfTab<0 ){
          /* Generating CHECK constraints or inserting into partial index */
          return pExpr->iColumn - pParse->iSelfTab;
        }else{
          /* Coding an expression that is part of an index where column names
          ** in the index refer to the table to which the index belongs */
          iTab = pParse->iSelfTab - 1;
        }
      }
      return sqlite3ExprCodeGetColumn(pParse, pExpr->y.pTab,
                               pExpr->iColumn, iTab, target,
                               pExpr->op2);
    }
    case TK_INTEGER: {
      codeInteger(pParse, pExpr, 0, target);
      return target;
    }
    case TK_TRUEFALSE: {
      sqlite3VdbeAddOp2(v, OP_Integer, sqlite3ExprTruthValue(pExpr), target);
      return target;
    }
#ifndef SQLITE_OMIT_FLOATING_POINT
    case TK_FLOAT: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      codeReal(v, pExpr->u.zToken, 0, target);
      return target;
    }
#endif
    case TK_STRING: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      sqlite3VdbeLoadString(v, target, pExpr->u.zToken);
      return target;
    }
    case TK_NULL: {
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      return target;
    }
#ifndef SQLITE_OMIT_BLOB_LITERAL
    case TK_BLOB: {
      int n;
      const char *z;
      char *zBlob;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
      assert( pExpr->u.zToken[1]=='\'' );
      z = &pExpr->u.zToken[2];
      n = sqlite3Strlen30(z) - 1;
      assert( z[n]=='\'' );
      zBlob = sqlite3HexToBlob(sqlite3VdbeDb(v), z, n);
      sqlite3VdbeAddOp4(v, OP_Blob, n/2, target, 0, zBlob, P4_DYNAMIC);
      return target;
    }
#endif
    case TK_VARIABLE: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken!=0 );
      assert( pExpr->u.zToken[0]!=0 );
      sqlite3VdbeAddOp2(v, OP_Variable, pExpr->iColumn, target);
      if( pExpr->u.zToken[1]!=0 ){
        const char *z = sqlite3VListNumToName(pParse->pVList, pExpr->iColumn);
        assert( pExpr->u.zToken[0]=='?' || strcmp(pExpr->u.zToken, z)==0 );
        pParse->pVList[0] = 0; /* Indicate VList may no longer be enlarged */
        sqlite3VdbeAppendP4(v, (char*)z, P4_STATIC);
      }
      return target;
    }
    case TK_REGISTER: {
      return pExpr->iTable;
    }
#ifndef SQLITE_OMIT_CAST
    case TK_CAST: {
      /* Expressions of the form:   CAST(pLeft AS token) */
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      if( inReg!=target ){
        sqlite3VdbeAddOp2(v, OP_SCopy, inReg, target);
        inReg = target;
      }
      sqlite3VdbeAddOp2(v, OP_Cast, target,
                        sqlite3AffinityType(pExpr->u.zToken, 0));
      return inReg;
    }
#endif /* SQLITE_OMIT_CAST */
    case TK_IS:
    case TK_ISNOT:
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      p5 = SQLITE_NULLEQ;
      /* fall-through */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      Expr *pLeft = pExpr->pLeft;
      if( sqlite3ExprIsVector(pLeft) ){
        codeVectorCompare(pParse, pExpr, target, op, p5);
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pLeft, &regFree1);
        r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
        codeCompare(pParse, pLeft, pExpr->pRight, op,
            r1, r2, inReg, SQLITE_STOREP2 | p5);
        assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
        assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
        assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
        assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
        assert(TK_EQ==OP_Eq); testcase(op==OP_Eq); VdbeCoverageIf(v,op==OP_Eq);
        assert(TK_NE==OP_Ne); testcase(op==OP_Ne); VdbeCoverageIf(v,op==OP_Ne);
        testcase( regFree1==0 );
        testcase( regFree2==0 );
      }
      break;
    }
    case TK_AND:
    case TK_OR:
    case TK_PLUS:
    case TK_STAR:
    case TK_MINUS:
    case TK_REM:
    case TK_BITAND:
    case TK_BITOR:
    case TK_SLASH:
    case TK_LSHIFT:
    case TK_RSHIFT: 
    case TK_CONCAT: {
      assert( TK_AND==OP_And );            testcase( op==TK_AND );
      assert( TK_OR==OP_Or );              testcase( op==TK_OR );
      assert( TK_PLUS==OP_Add );           testcase( op==TK_PLUS );
      assert( TK_MINUS==OP_Subtract );     testcase( op==TK_MINUS );
      assert( TK_REM==OP_Remainder );      testcase( op==TK_REM );
      assert( TK_BITAND==OP_BitAnd );      testcase( op==TK_BITAND );
      assert( TK_BITOR==OP_BitOr );        testcase( op==TK_BITOR );
      assert( TK_SLASH==OP_Divide );       testcase( op==TK_SLASH );
      assert( TK_LSHIFT==OP_ShiftLeft );   testcase( op==TK_LSHIFT );
      assert( TK_RSHIFT==OP_ShiftRight );  testcase( op==TK_RSHIFT );
      assert( TK_CONCAT==OP_Concat );      testcase( op==TK_CONCAT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      sqlite3VdbeAddOp3(v, op, r2, r1, target);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_UMINUS: {
      Expr *pLeft = pExpr->pLeft;
      assert( pLeft );
      if( pLeft->op==TK_INTEGER ){
        codeInteger(pParse, pLeft, 1, target);
        return target;
#ifndef SQLITE_OMIT_FLOATING_POINT
      }else if( pLeft->op==TK_FLOAT ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        codeReal(v, pLeft->u.zToken, 1, target);
        return target;
#endif
      }else{
        tempX.op = TK_INTEGER;
        tempX.flags = EP_IntValue|EP_TokenOnly;
        tempX.u.iValue = 0;
        r1 = sqlite3ExprCodeTemp(pParse, &tempX, &regFree1);
        r2 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree2);
        sqlite3VdbeAddOp3(v, OP_Subtract, r2, r1, target);
        testcase( regFree2==0 );
      }
      break;
    }
    case TK_BITNOT:
    case TK_NOT: {
      assert( TK_BITNOT==OP_BitNot );   testcase( op==TK_BITNOT );
      assert( TK_NOT==OP_Not );         testcase( op==TK_NOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      sqlite3VdbeAddOp2(v, op, r1, inReg);
      break;
    }
    case TK_TRUTH: {
      int isTrue;    /* IS TRUE or IS NOT TRUE */
      int bNormal;   /* IS TRUE or IS FALSE */
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      bNormal = pExpr->op2==TK_IS;
      testcase( isTrue && bNormal);
      testcase( !isTrue && bNormal);
      sqlite3VdbeAddOp4Int(v, OP_IsTrue, r1, inReg, !isTrue, isTrue ^ bNormal);
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      int addr;
      assert( TK_ISNULL==OP_IsNull );   testcase( op==TK_ISNULL );
      assert( TK_NOTNULL==OP_NotNull ); testcase( op==TK_NOTNULL );
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      addr = sqlite3VdbeAddOp1(v, op, r1);
      VdbeCoverageIf(v, op==TK_ISNULL);
      VdbeCoverageIf(v, op==TK_NOTNULL);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, target);
      sqlite3VdbeJumpHere(v, addr);
      break;
    }
    case TK_AGG_FUNCTION: {
      AggInfo *pInfo = pExpr->pAggInfo;
      if( pInfo==0 ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        sqlite3ErrorMsg(pParse, "misuse of aggregate: %s()", pExpr->u.zToken);
      }else{
        return pInfo->aFunc[pExpr->iAgg].iMem;
      }
      break;
    }
    case TK_FUNCTION: {
      ExprList *pFarg;       /* List of function arguments */
      int nFarg;             /* Number of function arguments */
      FuncDef *pDef;         /* The function definition object */
      const char *zId;       /* The function name */
      u32 constMask = 0;     /* Mask of function arguments that are constant */
      int i;                 /* Loop counter */
      sqlite3 *db = pParse->db;  /* The database connection */
      u8 enc = ENC(db);      /* The text encoding used by this database */
      CollSeq *pColl = 0;    /* A collating sequence */

#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(pExpr, EP_WinFunc) ){
        return pExpr->y.pWin->regResult;
      }
#endif

      if( ConstFactorOk(pParse) && sqlite3ExprIsConstantNotJoin(pExpr) ){
        /* SQL functions can be expensive. So try to move constant functions
        ** out of the inner loop, even if that means an extra OP_Copy. */
        return sqlite3ExprCodeAtInit(pParse, pExpr, -1);
      }
      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      if( ExprHasProperty(pExpr, EP_TokenOnly) ){
        pFarg = 0;
      }else{
        pFarg = pExpr->x.pList;
      }
      nFarg = pFarg ? pFarg->nExpr : 0;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      zId = pExpr->u.zToken;
      pDef = sqlite3FindFunction(db, zId, nFarg, enc, 0);
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
      if( pDef==0 && pParse->explain ){
        pDef = sqlite3FindFunction(db, "unknown", nFarg, enc, 0);
      }
#endif
      if( pDef==0 || pDef->xFinalize!=0 ){
        sqlite3ErrorMsg(pParse, "unknown function: %s()", zId);
        break;
      }

      /* Attempt a direct implementation of the built-in COALESCE() and
      ** IFNULL() functions.  This avoids unnecessary evaluation of
      ** arguments past the first non-NULL argument.
      */
      if( pDef->funcFlags & SQLITE_FUNC_COALESCE ){
        int endCoalesce = sqlite3VdbeMakeLabel(pParse);
        assert( nFarg>=2 );
        sqlite3ExprCode(pParse, pFarg->a[0].pExpr, target);
        for(i=1; i<nFarg; i++){
          sqlite3VdbeAddOp2(v, OP_NotNull, target, endCoalesce);
          VdbeCoverage(v);
          sqlite3ExprCode(pParse, pFarg->a[i].pExpr, target);
        }
        sqlite3VdbeResolveLabel(v, endCoalesce);
        break;
      }

      /* The UNLIKELY() function is a no-op.  The result is the value
      ** of the first argument.
      */
      if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
        assert( nFarg>=1 );
        return sqlite3ExprCodeTarget(pParse, pFarg->a[0].pExpr, target);
      }

#ifdef SQLITE_DEBUG
      /* The AFFINITY() function evaluates to a string that describes
      ** the type affinity of the argument.  This is used for testing of
      ** the SQLite type logic.
      */
      if( pDef->funcFlags & SQLITE_FUNC_AFFINITY ){
        const char *azAff[] = { "blob", "text", "numeric", "integer", "real" };
        char aff;
        assert( nFarg==1 );
        aff = sqlite3ExprAffinity(pFarg->a[0].pExpr);
        sqlite3VdbeLoadString(v, target, 
                              aff ? azAff[aff-SQLITE_AFF_BLOB] : "none");
        return target;
      }
#endif

      for(i=0; i<nFarg; i++){
        if( i<32 && sqlite3ExprIsConstant(pFarg->a[i].pExpr) ){
          testcase( i==31 );
          constMask |= MASKBIT32(i);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_NEEDCOLL)!=0 && !pColl ){
          pColl = sqlite3ExprCollSeq(pParse, pFarg->a[i].pExpr);
        }
      }
      if( pFarg ){
        if( constMask ){
          r1 = pParse->nMem+1;
          pParse->nMem += nFarg;
        }else{
          r1 = sqlite3GetTempRange(pParse, nFarg);
        }

        /* For length() and typeof() functions with a column argument,
        ** set the P5 parameter to the OP_Column opcode to OPFLAG_LENGTHARG
        ** or OPFLAG_TYPEOFARG respectively, to avoid unnecessary data
        ** loading.
        */
        if( (pDef->funcFlags & (SQLITE_FUNC_LENGTH|SQLITE_FUNC_TYPEOF))!=0 ){
          u8 exprOp;
          assert( nFarg==1 );
          assert( pFarg->a[0].pExpr!=0 );
          exprOp = pFarg->a[0].pExpr->op;
          if( exprOp==TK_COLUMN || exprOp==TK_AGG_COLUMN ){
            assert( SQLITE_FUNC_LENGTH==OPFLAG_LENGTHARG );
            assert( SQLITE_FUNC_TYPEOF==OPFLAG_TYPEOFARG );
            testcase( pDef->funcFlags & OPFLAG_LENGTHARG );
            pFarg->a[0].pExpr->op2 = 
                  pDef->funcFlags & (OPFLAG_LENGTHARG|OPFLAG_TYPEOFARG);
          }
        }

        sqlite3ExprCodeExprList(pParse, pFarg, r1, 0,
                                SQLITE_ECEL_DUP|SQLITE_ECEL_FACTOR);
      }else{
        r1 = 0;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
      /* Possibly overload the function if the first argument is
      ** a virtual table column.
      **
      ** For infix functions (LIKE, GLOB, REGEXP, and MATCH) use the
      ** second argument, not the first, as the argument to test to
      ** see if it is a column in a virtual table.  This is done because
      ** the left operand of infix functions (the operand we want to
      ** control overloading) ends up as the second argument to the
      ** function.  The expression "A glob B" is equivalent to 
      ** "glob(B,A).  We want to use the A in "A glob B" to test
      ** for function overloading.  But we use the B term in "glob(B,A)".
      */
      if( nFarg>=2 && ExprHasProperty(pExpr, EP_InfixFunc) ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[1].pExpr);
      }else if( nFarg>0 ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[0].pExpr);
      }
#endif
      if( pDef->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        if( !pColl ) pColl = db->pDfltColl; 
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0, 0, 0, (char *)pColl, P4_COLLSEQ);
      }
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
      if( pDef->funcFlags & SQLITE_FUNC_OFFSET ){
        Expr *pArg = pFarg->a[0].pExpr;
        if( pArg->op==TK_COLUMN ){
          sqlite3VdbeAddOp3(v, OP_Offset, pArg->iTable, pArg->iColumn, target);
        }else{
          sqlite3VdbeAddOp2(v, OP_Null, 0, target);
        }
      }else
#endif
      {
        sqlite3VdbeAddOp4(v, pParse->iSelfTab ? OP_PureFunc0 : OP_Function0,
                          constMask, r1, target, (char*)pDef, P4_FUNCDEF);
        sqlite3VdbeChangeP5(v, (u8)nFarg);
      }
      if( nFarg && constMask==0 ){
        sqlite3ReleaseTempRange(pParse, r1, nFarg);
      }
      return target;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_EXISTS:
    case TK_SELECT: {
      int nCol;
      testcase( op==TK_EXISTS );
      testcase( op==TK_SELECT );
      if( op==TK_SELECT && (nCol = pExpr->x.pSelect->pEList->nExpr)!=1 ){
        sqlite3SubselectError(pParse, nCol, 1);
      }else{
        return sqlite3CodeSubselect(pParse, pExpr);
      }
      break;
    }
    case TK_SELECT_COLUMN: {
      int n;
      if( pExpr->pLeft->iTable==0 ){
        pExpr->pLeft->iTable = sqlite3CodeSubselect(pParse, pExpr->pLeft);
      }
      assert( pExpr->iTable==0 || pExpr->pLeft->op==TK_SELECT );
      if( pExpr->iTable
       && pExpr->iTable!=(n = sqlite3ExprVectorSize(pExpr->pLeft)) 
      ){
        sqlite3ErrorMsg(pParse, "%d columns assigned %d values",
                                pExpr->iTable, n);
      }
      return pExpr->pLeft->iTable + pExpr->iColumn;
    }
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(pParse);
      int destIfNull = sqlite3VdbeMakeLabel(pParse);
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      sqlite3VdbeAddOp2(v, OP_AddImm, target, 0);
      sqlite3VdbeResolveLabel(v, destIfNull);
      return target;
    }
#endif /* SQLITE_OMIT_SUBQUERY */


    /*
    **    x BETWEEN y AND z
    **
    ** This is equivalent to
    **
    **    x>=y AND x<=z
    **
    ** X is stored in pExpr->pLeft.
    ** Y is stored in pExpr->pList->a[0].pExpr.
    ** Z is stored in pExpr->pList->a[1].pExpr.
    */
    case TK_BETWEEN: {
      exprCodeBetween(pParse, pExpr, target, 0, 0);
      return target;
    }
    case TK_SPAN:
    case TK_COLLATE: 
    case TK_UPLUS: {
      pExpr = pExpr->pLeft;
      goto expr_code_doover; /* 2018-04-28: Prevent deep recursion. OSSFuzz. */
    }

    case TK_TRIGGER: {
      /* If the opcode is TK_TRIGGER, then the expression is a reference
      ** to a column in the new.* or old.* pseudo-tables available to
      ** trigger programs. In this case Expr.iTable is set to 1 for the
      ** new.* pseudo-table, or 0 for the old.* pseudo-table. Expr.iColumn
      ** is set to the column of the pseudo-table to read, or to -1 to
      ** read the rowid field.
      **
      ** The expression is implemented using an OP_Param opcode. The p1
      ** parameter is set to 0 for an old.rowid reference, or to (i+1)
      ** to reference another column of the old.* pseudo-table, where 
      ** i is the index of the column. For a new.rowid reference, p1 is
      ** set to (n+1), where n is the number of columns in each pseudo-table.
      ** For a reference to any other column in the new.* pseudo-table, p1
      ** is set to (n+2+i), where n and i are as defined previously. For
      ** example, if the table on which triggers are being fired is
      ** declared as:
      **
      **   CREATE TABLE t1(a, b);
      **
      ** Then p1 is interpreted as follows:
      **
      **   p1==0   ->    old.rowid     p1==3   ->    new.rowid
      **   p1==1   ->    old.a         p1==4   ->    new.a
      **   p1==2   ->    old.b         p1==5   ->    new.b       
      */
      Table *pTab = pExpr->y.pTab;
      int p1 = pExpr->iTable * (pTab->nCol+1) + 1 + pExpr->iColumn;

      assert( pExpr->iTable==0 || pExpr->iTable==1 );
      assert( pExpr->iColumn>=-1 && pExpr->iColumn<pTab->nCol );
      assert( pTab->iPKey<0 || pExpr->iColumn!=pTab->iPKey );
      assert( p1>=0 && p1<(pTab->nCol*2+2) );

      sqlite3VdbeAddOp2(v, OP_Param, p1, target);
      VdbeComment((v, "r[%d]=%s.%s", target,
        (pExpr->iTable ? "new" : "old"),
        (pExpr->iColumn<0 ? "rowid" : pExpr->y.pTab->aCol[pExpr->iColumn].zName)
      ));

#ifndef SQLITE_OMIT_FLOATING_POINT
      /* If the column has REAL affinity, it may currently be stored as an
      ** integer. Use OP_RealAffinity to make sure it is really real.
      **
      ** EVIDENCE-OF: R-60985-57662 SQLite will convert the value back to
      ** floating point when extracting it from the record.  */
      if( pExpr->iColumn>=0 
       && pTab->aCol[pExpr->iColumn].affinity==SQLITE_AFF_REAL
      ){
        sqlite3VdbeAddOp1(v, OP_RealAffinity, target);
      }
#endif
      break;
    }

    case TK_VECTOR: {
      sqlite3ErrorMsg(pParse, "row value misused");
      break;
    }

    case TK_IF_NULL_ROW: {
      int addrINR;
      addrINR = sqlite3VdbeAddOp1(v, OP_IfNullRow, pExpr->iTable);
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      sqlite3VdbeJumpHere(v, addrINR);
      sqlite3VdbeChangeP3(v, addrINR, inReg);
      break;
    }

    /*
    ** Form A:
    **   CASE x WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form B:
    **   CASE WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form A is can be transformed into the equivalent form B as follows:
    **   CASE WHEN x=e1 THEN r1 WHEN x=e2 THEN r2 ...
    **        WHEN x=eN THEN rN ELSE y END
    **
    ** X (if it exists) is in pExpr->pLeft.
    ** Y is in the last element of pExpr->x.pList if pExpr->x.pList->nExpr is
    ** odd.  The Y is also optional.  If the number of elements in x.pList
    ** is even, then Y is omitted and the "otherwise" result is NULL.
    ** Ei is in pExpr->pList->a[i*2] and Ri is pExpr->pList->a[i*2+1].
    **
    ** The result of the expression is the Ri for the first matching Ei,
    ** or if there is no matching Ei, the ELSE term Y, or if there is
    ** no ELSE term, NULL.
    */
    default: assert( op==TK_CASE ); {
      int endLabel;                     /* GOTO label for end of CASE stmt */
      int nextCase;                     /* GOTO label for next WHEN clause */
      int nExpr;                        /* 2x number of WHEN terms */
      int i;                            /* Loop counter */
      ExprList *pEList;                 /* List of WHEN terms */
      struct ExprList_item *aListelem;  /* Array of WHEN terms */
      Expr opCompare;                   /* The X==Ei expression */
      Expr *pX;                         /* The X expression */
      Expr *pTest = 0;                  /* X==Ei (form A) or just Ei (form B) */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) && pExpr->x.pList );
      assert(pExpr->x.pList->nExpr > 0);
      pEList = pExpr->x.pList;
      aListelem = pEList->a;
      nExpr = pEList->nExpr;
      endLabel = sqlite3VdbeMakeLabel(pParse);
      if( (pX = pExpr->pLeft)!=0 ){
        exprNodeCopy(&tempX, pX);
        testcase( pX->op==TK_COLUMN );
        exprToRegister(&tempX, exprCodeVector(pParse, &tempX, &regFree1));
        testcase( regFree1==0 );
        memset(&opCompare, 0, sizeof(opCompare));
        opCompare.op = TK_EQ;
        opCompare.pLeft = &tempX;
        pTest = &opCompare;
        /* Ticket b351d95f9cd5ef17e9d9dbae18f5ca8611190001:
        ** The value in regFree1 might get SCopy-ed into the file result.
        ** So make sure that the regFree1 register is not reused for other
        ** purposes and possibly overwritten.  */
        regFree1 = 0;
      }
      for(i=0; i<nExpr-1; i=i+2){
        if( pX ){
          assert( pTest!=0 );
          opCompare.pRight = aListelem[i].pExpr;
        }else{
          pTest = aListelem[i].pExpr;
        }
        nextCase = sqlite3VdbeMakeLabel(pParse);
        testcase( pTest->op==TK_COLUMN );
        sqlite3ExprIfFalse(pParse, pTest, nextCase, SQLITE_JUMPIFNULL);
        testcase( aListelem[i+1].pExpr->op==TK_COLUMN );
        sqlite3ExprCode(pParse, aListelem[i+1].pExpr, target);
        sqlite3VdbeGoto(v, endLabel);
        sqlite3VdbeResolveLabel(v, nextCase);
      }
      if( (nExpr&1)!=0 ){
        sqlite3ExprCode(pParse, pEList->a[nExpr-1].pExpr, target);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      sqlite3VdbeResolveLabel(v, endLabel);
      break;
    }
#ifndef SQLITE_OMIT_TRIGGER
    case TK_RAISE: {
      assert( pExpr->affinity==OE_Rollback 
           || pExpr->affinity==OE_Abort
           || pExpr->affinity==OE_Fail
           || pExpr->affinity==OE_Ignore
      );
      if( !pParse->pTriggerTab ){
        sqlite3ErrorMsg(pParse,
                       "RAISE() may only be used within a trigger-program");
        return 0;
      }
      if( pExpr->affinity==OE_Abort ){
        sqlite3MayAbort(pParse);
      }
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      if( pExpr->affinity==OE_Ignore ){
        sqlite3VdbeAddOp4(
            v, OP_Halt, SQLITE_OK, OE_Ignore, 0, pExpr->u.zToken,0);
        VdbeCoverage(v);
      }else{
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_TRIGGER,
                              pExpr->affinity, pExpr->u.zToken, 0, 0);
      }

      break;
    }
#endif
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
  return inReg;
}